

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc.c
# Opt level: O2

size_t rtosc_message_ring_length(ring_t *ring)

{
  uint pos;
  uchar uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  size_t sVar11;
  uint uVar12;
  ulong uVar13;
  bool bVar14;
  
  uVar1 = deref(0,ring);
  if (((((uVar1 == '#') && (uVar1 = deref(1,ring), uVar1 == 'b')) &&
       (uVar1 = deref(2,ring), uVar1 == 'u')) &&
      ((uVar1 = deref(3,ring), uVar1 == 'n' && (uVar1 = deref(4,ring), uVar1 == 'd')))) &&
     ((uVar1 = deref(5,ring), uVar1 == 'l' &&
      ((uVar1 = deref(6,ring), uVar1 == 'e' && (uVar1 = deref(7,ring), uVar1 == '\0')))))) {
    uVar12 = 0x10;
    do {
      uVar13 = (ulong)uVar12;
      bVar2 = deref(uVar12,ring);
      bVar3 = deref(uVar12 + 1,ring);
      bVar4 = deref(uVar12 + 2,ring);
      bVar5 = deref(uVar12 + 3,ring);
      uVar10 = (uint)bVar5 | (uint)bVar4 << 8 | (uint)bVar3 << 0x10 | (uint)bVar2 << 0x18;
      uVar12 = uVar12 + uVar10 + 4;
    } while (uVar10 != 0);
LAB_00102a2e:
    sVar11 = 0;
    if (uVar13 <= ring[1].len + ring->len) {
      sVar11 = uVar13;
    }
  }
  else {
    uVar12 = 3;
    do {
      uVar10 = uVar12;
      uVar1 = deref(uVar10 - 3,ring);
      uVar12 = uVar10 + 1;
    } while (uVar1 != '\0');
    uVar12 = uVar10 - 3;
    iVar8 = 4;
    do {
      bVar14 = iVar8 == 0;
      iVar8 = iVar8 + -1;
      pos = uVar10 + 1;
      if (bVar14) break;
      uVar12 = uVar12 + 1;
      uVar1 = deref(uVar12,ring);
      pos = uVar12;
    } while (uVar1 == '\0');
    uVar1 = deref(pos,ring);
    sVar11 = 0;
    if (uVar1 == ',') {
      iVar8 = pos + 4;
      uVar12 = pos + 1;
      do {
        uVar1 = deref((int)sVar11 + uVar12,ring);
        iVar8 = iVar8 + 1;
        uVar10 = (int)sVar11 + 1;
        sVar11 = (size_t)uVar10;
      } while (uVar1 != '\0');
      iVar9 = 0;
      do {
        bVar2 = deref(uVar12,ring);
        uVar6 = bVar2 - 0x46;
        if (uVar6 < 0x2f) {
          iVar7 = 1;
          if ((0x708d70002000U >> ((ulong)uVar6 & 0x3f) & 1) == 0) {
            if ((0xa04109UL >> ((ulong)uVar6 & 0x3f) & 1) == 0) goto LAB_00102883;
            goto LAB_0010287a;
          }
        }
        else {
LAB_00102883:
          if (bVar2 == 0) goto code_r0x00102887;
LAB_0010287a:
          iVar7 = 0;
        }
        iVar9 = iVar9 + iVar7;
        uVar12 = uVar12 + 1;
      } while( true );
    }
  }
  return sVar11;
code_r0x00102887:
  uVar13 = (ulong)(iVar8 - (uVar10 & 3));
  uVar12 = pos;
switchD_001028d6_caseD_65:
  if (iVar9 == 0) goto LAB_00102a2e;
  uVar12 = uVar12 + 1;
  uVar1 = deref(uVar12,ring);
  uVar10 = (uint)uVar13;
  switch(uVar1) {
  case 'b':
    bVar2 = deref(uVar10,ring);
    bVar3 = deref(uVar10 + 1,ring);
    bVar4 = deref(uVar10 + 2,ring);
    bVar5 = deref(uVar10 + 3,ring);
    iVar8 = (uint)bVar2 * 0x1000000 + uVar10 + (uint)bVar3 * 0x10000;
    uVar6 = iVar8 + (uint)bVar5 + (uint)bVar4 * 0x100 + 4;
    uVar10 = ((uint)bVar5 + iVar8 + 4) - pos & 3;
    uVar13 = (ulong)((uVar6 - uVar10) + 4);
    if (uVar10 == 0) {
      uVar13 = (ulong)uVar6;
    }
    break;
  case 'c':
  case 'f':
  case 'i':
  case 'm':
  case 'r':
    uVar13 = (ulong)(uVar10 + 4);
    break;
  case 'd':
  case 'h':
  case 't':
    uVar13 = (ulong)(uVar10 + 8);
    break;
  case 'e':
  case 'g':
  case 'j':
  case 'k':
  case 'l':
  case 'n':
  case 'o':
  case 'p':
  case 'q':
    goto switchD_001028d6_caseD_65;
  case 's':
    goto switchD_001028d6_caseD_73;
  default:
    if (uVar1 != 'S') goto switchD_001028d6_caseD_65;
switchD_001028d6_caseD_73:
    iVar8 = uVar10 + 4;
    uVar6 = (byte)-(char)pos + uVar10;
    do {
      uVar10 = uVar10 + 1;
      uVar1 = deref(uVar10,ring);
      iVar8 = iVar8 + 1;
      bVar2 = (char)uVar6 + 1;
      uVar6 = (uint)bVar2;
    } while (uVar1 != '\0');
    uVar13 = (ulong)(iVar8 - (bVar2 & 3));
  }
  iVar9 = iVar9 + -1;
  goto switchD_001028d6_caseD_65;
}

Assistant:

size_t rtosc_message_ring_length(ring_t *ring)
{
    //Check if the message is a bundle
    if(deref(0,ring) == '#' &&
            deref(1,ring) == 'b' &&
            deref(2,ring) == 'u' &&
            deref(3,ring) == 'n' &&
            deref(4,ring) == 'd' &&
            deref(5,ring) == 'l' &&
            deref(6,ring) == 'e' &&
            deref(7,ring) == '\0')
        return bundle_ring_length(ring);

    //Proceed for normal messages
    //Consume path
    unsigned pos = 0;
    while(deref(pos++,ring));
    pos--;

    //Travel through the null word end [1..4] bytes
    for(int i=0; i<4; ++i)
        if(deref(++pos, ring))
            break;

    if(deref(pos, ring) != ',')
        return 0;

    unsigned aligned_pos = pos;
    int arguments = pos+1;
    while(deref(++pos,ring));
    pos += 4-(pos-aligned_pos)%4;

    unsigned toparse = 0;
    {
        int arg = arguments-1;
        while(deref(++arg,ring))
            toparse += has_reserved(deref(arg,ring));
    }

    //Take care of varargs
    while(toparse)
    {
        char arg = deref(arguments++,ring);
        assert(arg);
        uint32_t i;
        switch(arg) {
            case 'h':
            case 't':
            case 'd':
                pos += 8;
                --toparse;
                break;
            case 'm':
            case 'r':
            case 'c':
            case 'f':
            case 'i':
                pos += 4;
                --toparse;
                break;
            case 'S':
            case 's':
                while(deref(++pos,ring));
                pos += 4-(pos-aligned_pos)%4;
                --toparse;
                break;
            case 'b':
                i = 0;
                i |= (deref(pos++,ring) << 24);
                i |= (deref(pos++,ring) << 16);
                i |= (deref(pos++,ring) << 8);
                i |= (deref(pos++,ring));
                pos += i;
                if((pos-aligned_pos)%4)
                    pos += 4-(pos-aligned_pos)%4;
                --toparse;
                break;
            default:
                ;
        }
    }


    return pos <= (ring[0].len+ring[1].len) ? pos : 0;
}